

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

int __thiscall
rw::Clump::clone(Clump *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Atomic *pAVar1;
  int iVar2;
  Clump *this_00;
  Frame *pFVar3;
  Atomic *pAVar4;
  Atomic *this_01;
  undefined4 extraout_var;
  Frame *pFVar5;
  void *__child_stack_00;
  Atomic *atomic;
  Atomic *a;
  LLLink *lnk;
  LLLink *_next;
  Frame *root;
  Clump *clump;
  Clump *this_local;
  
  this_00 = create();
  pFVar3 = getFrame(this);
  pFVar3 = Frame::cloneAndLink(pFVar3);
  setFrame(this_00,pFVar3);
  a = (Atomic *)(this->atomics).link.next;
  while( true ) {
    pAVar1 = *(Atomic **)&(a->object).object;
    pAVar4 = (Atomic *)LinkList::end(&this->atomics);
    if (a == pAVar4) break;
    this_01 = Atomic::fromClump((LLLink *)a);
    iVar2 = Atomic::clone(this_01,(__fn *)pFVar3,__child_stack_00,(int)pAVar4,__arg);
    pFVar3 = (Frame *)CONCAT44(extraout_var,iVar2);
    pFVar5 = Atomic::getFrame(this_01);
    Atomic::setFrame((Atomic *)pFVar3,pFVar5->root);
    addAtomic(this_00,(Atomic *)pFVar3);
    a = pAVar1;
  }
  pFVar3 = getFrame(this);
  Frame::purgeClone(pFVar3);
  if (this->world != (World *)0x0) {
    World::addClump(this->world,this_00);
  }
  PluginList::copy((PluginList *)&s_plglist,(EVP_PKEY_CTX *)this_00,(EVP_PKEY_CTX *)this);
  return (int)this_00;
}

Assistant:

Clump*
Clump::clone(void)
{
	Clump *clump = Clump::create();
	Frame *root = this->getFrame()->cloneAndLink();
	clump->setFrame(root);
	FORLIST(lnk, this->atomics){
		Atomic *a = Atomic::fromClump(lnk);
		Atomic *atomic = a->clone();
		atomic->setFrame(a->getFrame()->root);
		clump->addAtomic(atomic);
	}
	this->getFrame()->purgeClone();

	// World extension
	if(this->world)
		this->world->addClump(clump);

	s_plglist.copy(clump, this);
	return clump;
}